

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.h
# Opt level: O0

void __thiscall S1Interval::set_lo(S1Interval *this,double p)

{
  bool bVar1;
  double *pdVar2;
  ostream *poVar3;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  double local_18;
  double p_local;
  S1Interval *this_local;
  
  local_18 = p;
  p_local = (double)this;
  pdVar2 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                     ((BasicVector<Vector2,_double,_2UL> *)this,0);
  *pdVar2 = p;
  bVar1 = is_valid(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
             ,0xfe,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: is_valid() ");
  S2LogMessageVoidify::operator&(&local_19,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

inline void S1Interval::set_lo(double p) {
  bounds_[0] = p;
  S2_DCHECK(is_valid());
}